

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_newclass(HSQUIRRELVM v,SQBool hasbase)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQObjectPtr *pSVar2;
  SQObjectValue this;
  SQClass *base;
  SQObjectPtr local_30;
  
  if (hasbase == 0) {
    base = (SQClass *)0x0;
  }
  else {
    pSVar2 = SQVM::GetUp(v,-1);
    if ((pSVar2->super_SQObject)._type != OT_CLASS) {
      sq_throwerror(v,"invalid base type");
      return -1;
    }
    base = (pSVar2->super_SQObject)._unVal.pClass;
  }
  ss = v->_sharedstate;
  this.pUserPointer = sq_vm_malloc(0x1c8);
  SQClass::SQClass(this.pClass,ss,base);
  if (base != (SQClass *)0x0) {
    SQVM::Pop(v);
  }
  local_30.super_SQObject._type = OT_CLASS;
  pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_30.super_SQObject._unVal.pUserPointer = this.pUserPointer;
  SQVM::Push(v,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_30);
  return 0;
}

Assistant:

SQRESULT sq_newclass(HSQUIRRELVM v,SQBool hasbase)
{
    SQClass *baseclass = NULL;
    if(hasbase) {
        SQObjectPtr &base = stack_get(v,-1);
        if(sq_type(base) != OT_CLASS)
            return sq_throwerror(v,_SC("invalid base type"));
        baseclass = _class(base);
    }
    SQClass *newclass = SQClass::Create(_ss(v), baseclass);
    if(baseclass) v->Pop();
    v->Push(newclass);
    return SQ_OK;
}